

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Ptr<Catch::IReporter> * __thiscall
Catch::Ptr<Catch::IReporter>::operator=(Ptr<Catch::IReporter> *this,IReporter *p)

{
  IReporter *pIVar1;
  
  if (p != (IReporter *)0x0) {
    (*(p->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(p);
  }
  pIVar1 = this->m_p;
  this->m_p = p;
  if (pIVar1 != (IReporter *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }